

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectDeclaration_Variable.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,VariableDeclarationSymbol *var)

{
  ostream *poVar1;
  Lexeme *this;
  Type *ty;
  string local_40;
  ObjectDeclarationSymbol *local_20;
  VariableDeclarationSymbol *var_local;
  ostream *os_local;
  
  local_20 = &var->super_ObjectDeclarationSymbol;
  var_local = (VariableDeclarationSymbol *)os;
  if (var == (VariableDeclarationSymbol *)0x0) {
    os_local = std::operator<<(os,"<Variable is null>");
  }
  else {
    std::operator<<(os,"<Variable |");
    poVar1 = std::operator<<((ostream *)var_local," name:");
    this = &ObjectDeclarationSymbol::name(local_20)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<((ostream *)var_local," type:");
    ty = ObjectDeclarationSymbol::type(local_20);
    operator<<(poVar1,ty);
    std::operator<<((ostream *)var_local,">");
    os_local = (ostream *)var_local;
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const VariableDeclarationSymbol* var)
{
    if (!var)
        return os << "<Variable is null>";
    os << "<Variable |";
    os << " name:" << var->name()->valueText();
    os << " type:" << var->type();
    os << ">";
    return os;
}